

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O0

bool __thiscall ProtocolBase::isValid(ProtocolBase *this,uint8_t *buf,size_t n)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ostream *poVar3;
  size_t n_local;
  uint8_t *buf_local;
  ProtocolBase *this_local;
  
  if ((*buf == 0x90) && (buf[1] == 0xeb)) {
    if (n == (long)(int)(buf[3] + 5)) {
      uVar1 = buf[n - 1];
      uVar2 = getChecksum(this,buf + 2,n - 3);
      if (uVar1 == uVar2) {
        this_local._7_1_ = true;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "WARNING::ProtocolWrite::Checksum is not suitable");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "WARNING::ProtocolWrite::Frame length is not suitable");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "WARNING::ProtcolWrite::Frame header not suitable");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool isValid(uint8_t *buf, size_t n) {
        if ((buf[0] != HEADER_RET_1) || (buf[1] != HEADER_RET_2)) {
            std::cout << "WARNING::ProtcolWrite::Frame header not suitable" << std::endl;
            return false;
        }
        if (n != (buf[3] + 5)) {
            std::cout << "WARNING::ProtocolWrite::Frame length is not suitable" << std::endl;
            return false;
        }

        if (buf[n - 1] != getChecksum(&buf[2], n - 3)) {
            std::cout << "WARNING::ProtocolWrite::Checksum is not suitable" << std::endl;
            return false;
        }

        return true;
    }